

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::ssl::set_trust_certificate
          (ssl *this,native_context_type nc,string_view pem,error_code *ec)

{
  ulong uVar1;
  error_category *peVar2;
  const_pointer buf;
  size_type sVar3;
  error_code local_60;
  X509 *local_50;
  X509 *cert;
  BIO *bp;
  error_category *local_38;
  X509_STORE *local_30;
  X509_STORE *cert_store;
  error_code *ec_local;
  native_context_type nc_local;
  string_view pem_local;
  
  cert_store = (X509_STORE *)pem._M_str;
  pem_local._M_len = pem._M_len;
  ec_local = (error_code *)this;
  nc_local = nc;
  local_30 = X509_STORE_new();
  if (local_30 == (X509_STORE *)0x0) {
    uVar1 = ERR_get_error();
    peVar2 = boost::asio::error::get_ssl_category();
    boost::system::error_code::error_code((error_code *)&bp,(int)uVar1,peVar2);
    *(BIO **)cert_store = bp;
    *(error_category **)(cert_store + 8) = local_38;
  }
  else {
    buf = ::std::basic_string_view<char,_std::char_traits<char>_>::data
                    ((basic_string_view<char,_std::char_traits<char>_> *)&nc_local);
    sVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&nc_local);
    cert = (X509 *)BIO_new_mem_buf(buf,(int)sVar3);
    local_50 = PEM_read_bio_X509_AUX((BIO *)cert,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
    BIO_free((BIO *)cert);
    if (local_50 == (X509 *)0x0) {
      X509_STORE_free(local_30);
      uVar1 = ERR_get_error();
      peVar2 = boost::asio::error::get_ssl_category();
      boost::system::error_code::error_code(&local_60,(int)uVar1,peVar2);
      *(undefined8 *)cert_store = local_60._0_8_;
      *(error_category **)(cert_store + 8) = local_60.cat_;
    }
    else {
      X509_STORE_add_cert(local_30,local_50);
      X509_free(local_50);
      SSL_CTX_set_cert_store((SSL_CTX *)ec_local,local_30);
    }
  }
  return;
}

Assistant:

void set_trust_certificate(native_context_type nc, string_view pem, error_code &ec)
{
#if defined TORRENT_USE_OPENSSL
	// create a new X.509 certificate store
	X509_STORE* cert_store = X509_STORE_new();
	if (!cert_store)
	{
		ec = error_code(int(ERR_get_error()), error::get_ssl_category());
		return;
	}

	// wrap the PEM certificate in a BIO, for openssl to read
	BIO* bp = BIO_new_mem_buf(
			const_cast<char*>(pem.data()),
			int(pem.size()));

	// parse the certificate into OpenSSL's internal representation
	X509* cert = PEM_read_bio_X509_AUX(bp, nullptr, nullptr, nullptr);
	BIO_free(bp);

	if (!cert)
	{
		X509_STORE_free(cert_store);
		ec = error_code(int(ERR_get_error()), error::get_ssl_category());
		return;
	}

	// add cert to cert_store
	X509_STORE_add_cert(cert_store, cert);
	X509_free(cert);

	// and lastly, replace the default cert store with ours
	SSL_CTX_set_cert_store(nc, cert_store);

#elif defined TORRENT_USE_GNUTLS
    gnutls_datum_t ca;
    ca.data = reinterpret_cast<unsigned char*>(const_cast<char*>(pem.data()));
    ca.size = unsigned(pem.size());

	// Warning: returns the number of certificates processed or a negative error code on error
	int ret = gnutls_certificate_set_x509_trust_mem(nc, &ca, GNUTLS_X509_FMT_PEM);
	if(ret < 0)
		ec = error_code(ret, error::get_ssl_category());
#endif
}